

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

void __thiscall
cmCustomCommandGenerator::cmCustomCommandGenerator
          (cmCustomCommandGenerator *this,cmCustomCommand *cc,string *config,cmLocalGenerator *lg,
          bool transformDepfile,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *crossConfig,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          computeInternalDepfile)

{
  _Rb_tree_header *p_Var1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  pointer pbVar2;
  cmLocalGenerator *ge_00;
  anon_unknown_dwarf_132e217 *this_01;
  cmCustomCommandGenerator *pcVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  string *psVar9;
  cmCustomCommandLines *pcVar10;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var11;
  cmGeneratorTarget *commandConfig;
  cmGeneratorTarget *this_02;
  string *psVar12;
  uint extraout_var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  pointer pcVar14;
  uint uVar15;
  string *p;
  pointer pbVar16;
  string *clarg;
  string_view arg;
  string_view arg_00;
  string_view input;
  string_view input_00;
  string_view input_01;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *in_stack_fffffffffffffe78;
  _Any_data __tmp;
  undefined8 local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  cmCustomCommandGenerator *local_150;
  string parsed_arg;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_90;
  pointer local_88;
  pointer local_80;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_58;
  
  this->CC = cc;
  local_160 = &this->OutputConfig;
  if ((crossConfig->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == false) {
    crossConfig = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)config;
  }
  std::__cxx11::string::string((string *)local_160,(string *)crossConfig);
  local_158 = &this->CommandConfig;
  std::__cxx11::string::string((string *)local_158,(string *)config);
  psVar9 = cmCustomCommand::GetTarget_abi_cxx11_(cc);
  std::__cxx11::string::string((string *)&this->Target,(string *)psVar9);
  this->LG = lg;
  bVar5 = cmCustomCommand::GetEscapeOldStyle(cc);
  this->OldStyle = bVar5;
  bVar5 = cmCustomCommand::GetEscapeAllowMakeVars(cc);
  this->MakeVars = bVar5;
  (this->CommandLines).super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CommandLines).super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CommandLines).super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar10 = cmCustomCommand::GetCommandLines(cc);
  local_90 = &this->EmulatorsWithArguments;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(local_90,((long)(pcVar10->
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pcVar10->
                          super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18,
           (allocator_type *)&parsed_arg);
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Byproducts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Byproducts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Outputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Byproducts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Outputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Outputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->WorkingDirectory)._M_dataplus._M_p = (pointer)&(this->WorkingDirectory).field_2;
  (this->WorkingDirectory)._M_string_length = 0;
  (this->WorkingDirectory).field_2._M_local_buf[0] = '\0';
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->ComputeInternalDepfile;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_00,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)computeInternalDepfile.super__Function_base._M_functor._M_unused._0_8_);
  if ((this->ComputeInternalDepfile).super__Function_base._M_manager == (_Manager_type)0x0) {
    __tmp._8_8_ = 0;
    parsed_arg._M_dataplus._M_p = *(pointer *)&(this_00->super__Function_base)._M_functor;
    parsed_arg._M_string_length =
         *(size_type *)((long)&(this->ComputeInternalDepfile).super__Function_base._M_functor + 8);
    *(cmCustomCommandGenerator **)&(this_00->super__Function_base)._M_functor = this;
    *(undefined8 *)((long)&(this->ComputeInternalDepfile).super__Function_base._M_functor + 8) = 0;
    parsed_arg.field_2._M_allocated_capacity = 0;
    (this->ComputeInternalDepfile).super__Function_base._M_manager =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCustomCommandGenerator.cxx:170:7)>
         ::_M_manager;
    parsed_arg.field_2._8_8_ = (this->ComputeInternalDepfile)._M_invoker;
    (this->ComputeInternalDepfile)._M_invoker =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCustomCommandGenerator.cxx:170:7)>
         ::_M_invoke;
    __tmp._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)&parsed_arg);
  }
  psVar9 = &this->WorkingDirectory;
  p_Var11 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             *)cmCustomCommand::GetBacktrace(cc);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_68,p_Var11);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  commandConfig = cmLocalGenerator::FindGeneratorTargetToUse(lg,&this->Target);
  bVar5 = std::operator!=(local_160,local_158);
  pcVar10 = cmCustomCommand::GetCommandLines(this->CC);
  local_88 = (pcVar10->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pcVar14 = (pcVar10->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_150 = this;
  while (pcVar3 = local_150, pcVar14 != local_88) {
    local_168 = 0;
    __tmp._M_unused._M_object = (void *)0x0;
    __tmp._8_8_ = 0;
    pbVar2 = (pcVar14->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar15 = 0;
    local_80 = pcVar14;
    for (pbVar16 = (pcVar14->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar2;
        pbVar16 = pbVar16 + 1) {
      input._M_str = (char *)&ge;
      input._M_len = (size_t)(pbVar16->_M_dataplus)._M_p;
      anon_unknown.dwarf_132e217::EvaluateSplitConfigGenex
                (&parsed_arg,(anon_unknown_dwarf_132e217 *)pbVar16->_M_string_length,input,
                 (cmGeneratorExpression *)this->LG,(cmLocalGenerator *)(ulong)uVar15,
                 SUB81(local_160,0),local_158,(string *)commandConfig,
                 (cmGeneratorTarget *)&this->Utilities,in_stack_fffffffffffffe78);
      bVar6 = cmCustomCommand::GetCommandExpandLists(this->CC);
      if (bVar6) {
        arg._M_str = parsed_arg._M_dataplus._M_p;
        arg._M_len = parsed_arg._M_string_length;
        cmExpandedList_abi_cxx11_(&local_a8,arg,false);
        ::cm::
        append<cmCustomCommandLine,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((cmCustomCommandLine *)&__tmp,&local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __tmp._M_pod_data,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parsed_arg)
        ;
      }
      uVar15 = (uint)(byte)((byte)uVar15 | bVar5);
      std::__cxx11::string::~string((string *)&parsed_arg);
    }
    if (__tmp._M_unused._M_object == (void *)__tmp._8_8_) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__tmp);
    }
    else {
      this_02 = cmLocalGenerator::FindGeneratorTargetToUse
                          (local_150->LG,(string *)__tmp._M_unused._0_8_);
      if (this_02 != (cmGeneratorTarget *)0x0) {
        TVar7 = cmGeneratorTarget::GetType(this_02);
        if (TVar7 == EXECUTABLE) {
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this_02);
          std::__cxx11::string::string((string *)&local_58,(string *)psVar12);
          local_58.second = true;
          p_Var11 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     *)cmCustomCommand::GetBacktrace(cc);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_78,p_Var11);
          BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
          ::BT((BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                *)&parsed_arg,&local_58,(cmListFileBacktrace *)&local_78);
          std::
          _Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
          ::_M_emplace_unique<BT<std::pair<std::__cxx11::string,bool>>>
                    ((_Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
                      *)&this->Utilities,
                     (BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                      *)&parsed_arg);
          BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
          ::~BT((BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                 *)&parsed_arg);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&(this->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (cmCustomCommandLine *)&__tmp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__tmp);
    pcVar14 = local_80 + 1;
  }
  if ((transformDepfile) &&
     ((local_150->CommandLines).
      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_150->CommandLines).
      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    psVar12 = cmCustomCommand::GetDepfile_abi_cxx11_(cc);
    if (psVar12->_M_string_length != 0) {
      (*pcVar3->LG->GlobalGenerator->_vptr_cmGlobalGenerator[0x32])();
      if ((extraout_var & 1) != 0) {
        __tmp._M_unused._M_object = (void *)0x0;
        __tmp._8_8_ = 0;
        local_168 = 0;
        psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__tmp,psVar12);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __tmp._M_pod_data,(char (*) [3])"-E");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[24]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __tmp._M_pod_data,(char (*) [24])"cmake_transform_depfile");
        (*pcVar3->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&parsed_arg);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __tmp._M_pod_data,&parsed_arg);
        std::__cxx11::string::~string((string *)&parsed_arg);
        iVar8 = (*pcVar3->LG->GlobalGenerator->_vptr_cmGlobalGenerator[0x32])();
        if (iVar8 == 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[11]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __tmp._M_pod_data,(char (*) [11])"gccdepfile");
        }
        else if (iVar8 == 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[12]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __tmp._M_pod_data,(char (*) [12])"makedepfile");
        }
        else if (iVar8 == 2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[24]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __tmp._M_pod_data,(char (*) [24])"MSBuildAdditionalInputs");
        }
        psVar12 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar3->LG);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__tmp,psVar12);
        psVar12 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar3->LG);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__tmp,psVar12);
        psVar12 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar3->LG);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__tmp,psVar12);
        psVar12 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3->LG);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__tmp,psVar12);
        GetFullDepfile_abi_cxx11_(&parsed_arg,pcVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __tmp._M_pod_data,&parsed_arg);
        std::__cxx11::string::~string((string *)&parsed_arg);
        GetInternalDepfile_abi_cxx11_(&parsed_arg,pcVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __tmp._M_pod_data,&parsed_arg);
        std::__cxx11::string::~string((string *)&parsed_arg);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&(this->CommandLines).
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (cmCustomCommandLine *)&__tmp);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__tmp);
      }
    }
  }
  pvVar13 = cmCustomCommand::GetOutputs_abi_cxx11_(cc);
  anon_unknown.dwarf_132e217::EvaluateOutputs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsed_arg,pvVar13,&ge,pcVar3->LG,local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->Outputs,&parsed_arg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsed_arg);
  pvVar13 = cmCustomCommand::GetByproducts_abi_cxx11_(cc);
  anon_unknown.dwarf_132e217::EvaluateOutputs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsed_arg,pvVar13,&ge,pcVar3->LG,local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->Byproducts,&parsed_arg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsed_arg);
  pvVar13 = cmCustomCommand::GetDepends_abi_cxx11_(cc);
  ge_00 = pcVar3->LG;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  pbVar2 = (pvVar13->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar16 = (pvVar13->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = local_a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, pcVar3 = local_150, pbVar16 != pbVar2;
      pbVar16 = pbVar16 + 1) {
    input_00._M_str = (char *)&ge;
    input_00._M_len = (size_t)(pbVar16->_M_dataplus)._M_p;
    anon_unknown.dwarf_132e217::EvaluateSplitConfigGenex
              (&parsed_arg,(anon_unknown_dwarf_132e217 *)pbVar16->_M_string_length,input_00,
               (cmGeneratorExpression *)ge_00,(cmLocalGenerator *)&DAT_00000001,SUB81(local_160,0),
               local_158,(string *)0x0,(cmGeneratorTarget *)0x0,in_stack_fffffffffffffe78);
    arg_00._M_str = parsed_arg._M_dataplus._M_p;
    arg_00._M_len = parsed_arg._M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__tmp,arg_00,false);
    ::cm::
    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&local_a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__tmp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__tmp);
    std::__cxx11::string::~string((string *)&parsed_arg);
  }
  for (pbVar16 = local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar4; pbVar16 = pbVar16 + 1
      ) {
    bVar5 = cmsys::SystemTools::FileIsFullPath(pbVar16);
    if (bVar5) {
      cmsys::SystemTools::CollapseFullPath(&parsed_arg,pbVar16);
      std::__cxx11::string::operator=((string *)pbVar16,(string *)&parsed_arg);
      std::__cxx11::string::~string((string *)&parsed_arg);
    }
    else {
      cmsys::SystemTools::ConvertToUnixSlashes(pbVar16);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->Depends,&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  this_01 = (anon_unknown_dwarf_132e217 *)(pcVar3->CC->WorkingDirectory)._M_string_length;
  if (this_01 != (anon_unknown_dwarf_132e217 *)0x0) {
    input_01._M_str = (char *)&ge;
    input_01._M_len = (size_t)(pcVar3->CC->WorkingDirectory)._M_dataplus._M_p;
    anon_unknown.dwarf_132e217::EvaluateSplitConfigGenex
              (&parsed_arg,this_01,input_01,(cmGeneratorExpression *)pcVar3->LG,
               (cmLocalGenerator *)&DAT_00000001,SUB81(local_160,0),local_158,
               (string *)commandConfig,(cmGeneratorTarget *)0x0,in_stack_fffffffffffffe78);
    std::__cxx11::string::operator=((string *)psVar9,(string *)&parsed_arg);
    std::__cxx11::string::~string((string *)&parsed_arg);
    if ((pcVar3->WorkingDirectory)._M_string_length != 0) {
      psVar12 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3->LG);
      cmsys::SystemTools::CollapseFullPath(&parsed_arg,psVar9,psVar12);
      std::__cxx11::string::operator=((string *)psVar9,(string *)&parsed_arg);
      std::__cxx11::string::~string((string *)&parsed_arg);
    }
  }
  FillEmulatorsWithArguments(pcVar3);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

cmCustomCommandGenerator::cmCustomCommandGenerator(
  cmCustomCommand const& cc, std::string config, cmLocalGenerator* lg,
  bool transformDepfile, cm::optional<std::string> crossConfig,
  std::function<std::string(const std::string&, const std::string&)>
    computeInternalDepfile)
  : CC(&cc)
  , OutputConfig(crossConfig ? *crossConfig : config)
  , CommandConfig(std::move(config))
  , Target(cc.GetTarget())
  , LG(lg)
  , OldStyle(cc.GetEscapeOldStyle())
  , MakeVars(cc.GetEscapeAllowMakeVars())
  , EmulatorsWithArguments(cc.GetCommandLines().size())
  , ComputeInternalDepfile(std::move(computeInternalDepfile))
{
  if (!this->ComputeInternalDepfile) {
    this->ComputeInternalDepfile =
      [this](const std::string& cfg, const std::string& file) -> std::string {
      return this->GetInternalDepfileName(cfg, file);
    };
  }

  cmGeneratorExpression ge(cc.GetBacktrace());
  cmGeneratorTarget const* target{ lg->FindGeneratorTargetToUse(
    this->Target) };

  bool const distinctConfigs = this->OutputConfig != this->CommandConfig;

  const cmCustomCommandLines& cmdlines = this->CC->GetCommandLines();
  for (cmCustomCommandLine const& cmdline : cmdlines) {
    cmCustomCommandLine argv;
    // For the command itself, we default to the COMMAND_CONFIG.
    bool useOutputConfig = false;
    for (std::string const& clarg : cmdline) {
      std::string parsed_arg = EvaluateSplitConfigGenex(
        clarg, ge, this->LG, useOutputConfig, this->OutputConfig,
        this->CommandConfig, target, &this->Utilities);
      if (this->CC->GetCommandExpandLists()) {
        cm::append(argv, cmExpandedList(parsed_arg));
      } else {
        argv.push_back(std::move(parsed_arg));
      }

      if (distinctConfigs) {
        // For remaining arguments, we default to the OUTPUT_CONFIG.
        useOutputConfig = true;
      }
    }

    if (!argv.empty()) {
      // If the command references an executable target by name,
      // collect the target to add a target-level dependency on it.
      cmGeneratorTarget* gt = this->LG->FindGeneratorTargetToUse(argv.front());
      if (gt && gt->GetType() == cmStateEnums::EXECUTABLE) {
        // GetArgv0Location uses the command config, so use a cross-dependency.
        bool const cross = true;
        this->Utilities.emplace(BT<std::pair<std::string, bool>>(
          { gt->GetName(), cross }, cc.GetBacktrace()));
      }
    } else {
      // Later code assumes at least one entry exists, but expanding
      // lists on an empty command may have left this empty.
      // FIXME: Should we define behavior for removing empty commands?
      argv.emplace_back();
    }

    this->CommandLines.push_back(std::move(argv));
  }

  if (transformDepfile && !this->CommandLines.empty() &&
      !cc.GetDepfile().empty() &&
      this->LG->GetGlobalGenerator()->DepfileFormat()) {
    cmCustomCommandLine argv;
    argv.push_back(cmSystemTools::GetCMakeCommand());
    argv.emplace_back("-E");
    argv.emplace_back("cmake_transform_depfile");
    argv.push_back(this->LG->GetGlobalGenerator()->GetName());
    switch (*this->LG->GetGlobalGenerator()->DepfileFormat()) {
      case cmDepfileFormat::GccDepfile:
        argv.emplace_back("gccdepfile");
        break;
      case cmDepfileFormat::MakeDepfile:
        argv.emplace_back("makedepfile");
        break;
      case cmDepfileFormat::MSBuildAdditionalInputs:
        argv.emplace_back("MSBuildAdditionalInputs");
        break;
    }
    argv.push_back(this->LG->GetSourceDirectory());
    argv.push_back(this->LG->GetCurrentSourceDirectory());
    argv.push_back(this->LG->GetBinaryDirectory());
    argv.push_back(this->LG->GetCurrentBinaryDirectory());
    argv.push_back(this->GetFullDepfile());
    argv.push_back(this->GetInternalDepfile());

    this->CommandLines.push_back(std::move(argv));
  }

  this->Outputs =
    EvaluateOutputs(cc.GetOutputs(), ge, this->LG, this->OutputConfig);
  this->Byproducts =
    EvaluateOutputs(cc.GetByproducts(), ge, this->LG, this->OutputConfig);
  this->Depends = EvaluateDepends(cc.GetDepends(), ge, this->LG,
                                  this->OutputConfig, this->CommandConfig);

  const std::string& workingdirectory = this->CC->GetWorkingDirectory();
  if (!workingdirectory.empty()) {
    this->WorkingDirectory = EvaluateSplitConfigGenex(
      workingdirectory, ge, this->LG, true, this->OutputConfig,
      this->CommandConfig, target);
    // Convert working directory to a full path.
    if (!this->WorkingDirectory.empty()) {
      std::string const& build_dir = this->LG->GetCurrentBinaryDirectory();
      this->WorkingDirectory =
        cmSystemTools::CollapseFullPath(this->WorkingDirectory, build_dir);
    }
  }

  this->FillEmulatorsWithArguments();
}